

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandSymFun(Abc_Frame_t *pAbc,int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  size_t sVar9;
  uint *Sign;
  size_t sVar10;
  char *__s;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  uint fVerbose;
  uint uVar14;
  char *pcVar15;
  uint nVars;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  fVerbose = 0;
  Extra_UtilGetoptReset();
  iVar8 = -1;
LAB_0026b915:
  while (iVar7 = Extra_UtilGetopt(argc,argv,"Nvh"), iVar13 = globalUtilOptind, iVar7 == 0x76) {
    fVerbose = fVerbose ^ 1;
  }
  if (iVar7 == -1) {
    if (iVar8 != -1) {
      if (iVar8 - 0x11U < 0xfffffff0) {
        printf("Cannot generate functions for less than 1 and more than %d variables.\n");
        return 1;
      }
      Ntk_SymFunGenerate(iVar8,fVerbose);
      return 0;
    }
    if (globalUtilOptind + 1 == argc) {
      pcVar15 = argv[globalUtilOptind];
      sVar9 = strlen(pcVar15);
      iVar8 = (int)sVar9;
      nVars = iVar8 - 1;
      if ((int)nVars < 0) goto LAB_0026bab0;
      uVar12 = 0;
      while ((pcVar15[uVar12] & 0xfeU) == 0x30) {
        uVar12 = uVar12 + 1;
        if ((sVar9 & 0xffffffff) == uVar12) {
LAB_0026bab0:
          iVar13 = 1 << ((char)sVar9 - 7U & 0x1f);
          if ((int)nVars < 7) {
            iVar13 = 1;
          }
          Sign = (uint *)calloc((long)iVar13,8);
          sVar10 = strlen(pcVar15);
          auVar6 = _DAT_0095b0f0;
          auVar5 = _DAT_0094e250;
          if (iVar8 != (int)sVar10) {
            __assert_fail("(int)strlen(pOnes) == nVars + 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                          ,0xdad,"word *Abc_TtSymFunGenerate(char *, int)");
          }
          if (nVars != 0x1f) {
            iVar13 = iVar8 + -2;
            auVar16._4_4_ = iVar13;
            auVar16._0_4_ = iVar13;
            auVar16._8_4_ = iVar13;
            auVar16._12_4_ = iVar13;
            uVar11 = 0;
            auVar16 = auVar16 ^ _DAT_0094e250;
            do {
              if ((int)nVars < 1) {
                uVar12 = 0;
              }
              else {
                auVar23 = (undefined1  [16])0x0;
                auVar19 = auVar6;
                uVar14 = iVar8 + 2U & 0xfffffffc;
                do {
                  auVar17 = auVar19;
                  auVar18 = auVar23;
                  auVar19 = pshuflw(auVar18,auVar17,0xfe);
                  auVar22 = pshuflw(in_XMM11,auVar17,0x54);
                  auVar21._0_8_ = auVar17._8_8_;
                  auVar21._8_4_ = auVar17._8_4_;
                  auVar21._12_4_ = auVar17._12_4_;
                  auVar23 = pshuflw(auVar22,auVar21,0xfe);
                  auVar1._4_4_ = uVar11;
                  auVar1._0_4_ = uVar11;
                  auVar1._8_4_ = uVar11;
                  auVar1._12_4_ = uVar11;
                  lVar20 = auVar23._0_8_;
                  auVar3._4_8_ = auVar1._8_8_;
                  auVar3._0_4_ = uVar11 >> lVar20;
                  auVar25._0_8_ = auVar3._0_8_ << 0x20;
                  auVar25._8_4_ = uVar11 >> lVar20;
                  auVar25._12_4_ = uVar11 >> lVar20;
                  auVar23 = pshuflw(auVar21,auVar21,0x54);
                  auVar2._4_4_ = uVar11;
                  auVar2._0_4_ = uVar11;
                  auVar2._8_4_ = uVar11;
                  auVar2._12_4_ = uVar11;
                  lVar20 = auVar23._0_8_;
                  auVar4._4_8_ = auVar2._8_8_;
                  auVar4._0_4_ = uVar11 >> lVar20;
                  auVar24._0_8_ = auVar4._0_8_ << 0x20;
                  auVar24._8_4_ = uVar11 >> lVar20;
                  auVar24._12_4_ = uVar11 >> lVar20;
                  in_XMM11._8_8_ = auVar25._8_8_;
                  in_XMM11._0_8_ = auVar24._8_8_;
                  auVar23._0_4_ = (uVar11 >> auVar22._0_8_ & 1) + auVar18._0_4_;
                  auVar23._4_4_ = (uVar11 >> auVar19._0_8_ & 1) + auVar18._4_4_;
                  auVar23._8_4_ = (auVar24._8_4_ & 1) + auVar18._8_4_;
                  auVar23._12_4_ = (auVar25._12_4_ & 1) + auVar18._12_4_;
                  auVar19._0_4_ = auVar17._0_4_ + 4;
                  auVar19._4_4_ = auVar17._4_4_ + 4;
                  auVar19._8_4_ = auVar17._8_4_ + 4;
                  auVar19._12_4_ = auVar17._12_4_ + 4;
                  uVar14 = uVar14 - 4;
                } while (uVar14 != 0);
                auVar17 = auVar17 ^ auVar5;
                auVar22._0_4_ = -(uint)(auVar16._0_4_ < auVar17._0_4_);
                auVar22._4_4_ = -(uint)(auVar16._4_4_ < auVar17._4_4_);
                auVar22._8_4_ = -(uint)(auVar16._8_4_ < auVar17._8_4_);
                auVar22._12_4_ = -(uint)(auVar16._12_4_ < auVar17._12_4_);
                auVar23 = ~auVar22 & auVar23 | auVar18 & auVar22;
                uVar12 = (ulong)(uint)(auVar23._12_4_ + auVar23._4_4_ +
                                      auVar23._8_4_ + auVar23._0_4_);
              }
              if (pcVar15[uVar12] == '1') {
                *(ulong *)(Sign + (ulong)(uVar11 >> 6) * 2) =
                     *(ulong *)(Sign + (ulong)(uVar11 >> 6) * 2) ^ 1L << ((byte)uVar11 & 0x3f);
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 != 1 << ((byte)nVars & 0x1f));
          }
          iVar8 = 2;
          if (2 < (int)nVars) {
            iVar8 = (1 << ((char)sVar9 - 3U & 0x1f)) + 1;
          }
          pcVar15 = (char *)calloc((long)iVar8,1);
          Extra_PrintHexadecimalString(pcVar15,Sign,nVars);
          if (Sign != (uint *)0x0) {
            free(Sign);
          }
          if (fVerbose == 0) {
            if ((int)nVars < 9) {
              puts(pcVar15);
            }
          }
          else if ((int)nVars < 7) {
            printf("Generated truth table of the %d-variable function (%s) and set it as the current network\n"
                   ,(ulong)nVars,pcVar15);
          }
          else {
            printf("Generated truth table of the %d-variable function and set it as the current network.\n"
                   ,(ulong)nVars);
          }
          sVar9 = strlen(pcVar15);
          __s = (char *)calloc(sVar9 + 100,1);
          sprintf(__s,"read_truth %s",pcVar15);
          Cmd_CommandExecute(pAbc,__s);
          if (__s != (char *)0x0) {
            free(__s);
          }
          if (pcVar15 != (char *)0x0) {
            free(pcVar15);
            return 0;
          }
          return 0;
        }
      }
      pcVar15 = "The string should be composed of zeros and ones.\n";
    }
    else {
      pcVar15 = "Not enough command-line arguments.\n";
    }
    iVar8 = -1;
  }
  else {
    if (iVar7 == 0x68) goto LAB_0026b9aa;
    if (iVar7 != 0x4e) {
      pcVar15 = "Unknown switch.\n";
      iVar8 = -2;
      goto LAB_0026b9a3;
    }
    if (globalUtilOptind < argc) {
      iVar8 = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar13 + 1;
      goto LAB_0026b915;
    }
    pcVar15 = "Command line switch \"-N\" should be followed by a file name.\n";
    iVar8 = -1;
LAB_0026b9a3:
    Abc_Print(iVar8,pcVar15);
LAB_0026b9aa:
    Abc_Print(-2,"usage: symfun [-N num] [-vh] <ones>\n");
    Abc_Print(-2,"\t           generated a single-output symmetric function\n");
    Abc_Print(-2,
              "\t-N <num> : prints truth tables of all N-var symmetric functions [default = not used]\n"
             );
    pcVar15 = "yes";
    if (fVerbose == 0) {
      pcVar15 = "no";
    }
    Abc_Print(-2,"\t-v       : toggle verbose output [default = %s]\n",pcVar15);
    Abc_Print(-2,"\t-h       : print the command usage\n");
    Abc_Print(-2,
              "\t<ones>   : the string of N+1 zeros and ones, where N is the number of variables\n")
    ;
    Abc_Print(-2,"\t           For example, to get 3-input NAND-gate, use \"symfun 1000\".\n");
    pcVar15 = "\t           To get 5-input majority gate, use \"symfun 000111\".\n";
    iVar8 = -2;
  }
  Abc_Print(iVar8,pcVar15);
  return 1;
}

Assistant:

int Abc_CommandSymFun( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Ntk_SymFunGenerate( int nVars, int fVerbose );
    word * pFun = NULL;
    char * pStr,  * pTruth, * pCommand;
    int c, k, nVars = -1, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by a file name.\n" );
                goto usage;
            }
            nVars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }
    if ( nVars != -1 )
    {
        if ( nVars < 1 || nVars > 16 )
        {
            printf( "Cannot generate functions for less than 1 and more than %d variables.\n", nVars );
            return 1;
        }
        Ntk_SymFunGenerate( nVars, fVerbose );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
    {
        Abc_Print( -1, "Not enough command-line arguments.\n" );
        return 1;
    }
    // make sure the string is composed of N+1 zeros and ones
    pStr = argv[globalUtilOptind];
    nVars = strlen(pStr) - 1;
    for ( k = 0; k <= nVars; k++ )
        if ( pStr[k] != '0' && pStr[k] != '1' )
            break;
    if ( k <= nVars )
    {
        Abc_Print( -1, "The string should be composed of zeros and ones.\n" );
        return 1;
    }
    // generate and print one function
    pFun = Abc_TtSymFunGenerate( pStr, nVars );
    pTruth = ABC_CALLOC( char, nVars > 2 ? (1 << (nVars-2)) + 1 : 2 );
    Extra_PrintHexadecimalString( pTruth, (unsigned *)pFun, nVars );
    ABC_FREE( pFun );
    if ( fVerbose )
    {
        if ( nVars > 6 )
            printf( "Generated truth table of the %d-variable function and set it as the current network.\n", nVars );
        else
            printf( "Generated truth table of the %d-variable function (%s) and set it as the current network\n", nVars, pTruth );
    }
    else if ( nVars <= 8 )
        printf( "%s\n", pTruth );
    // read the truth table to be the current network in ABC
    pCommand = ABC_CALLOC( char, strlen(pTruth) + 100 );
    sprintf( pCommand, "read_truth %s", pTruth );
    Cmd_CommandExecute( pAbc, pCommand );
    ABC_FREE( pCommand );
    ABC_FREE( pTruth );
    return 0;

usage:
    Abc_Print( -2, "usage: symfun [-N num] [-vh] <ones>\n" );
    Abc_Print( -2, "\t           generated a single-output symmetric function\n" );
    Abc_Print( -2, "\t-N <num> : prints truth tables of all N-var symmetric functions [default = not used]\n" );
    Abc_Print( -2, "\t-v       : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    Abc_Print( -2, "\t<ones>   : the string of N+1 zeros and ones, where N is the number of variables\n" );
    Abc_Print( -2, "\t           For example, to get 3-input NAND-gate, use \"symfun 1000\".\n" );
    Abc_Print( -2, "\t           To get 5-input majority gate, use \"symfun 000111\".\n" );

    return 1;
}